

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_enc.cc
# Opt level: O1

bool woff2::ConvertTTFToWOFF2
               (uint8_t *data,size_t length,uint8_t *result,size_t *result_length,
               WOFF2Params *params)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *this;
  short sVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  iterator iVar5;
  WOFF2Params *pWVar6;
  uint8_t *puVar7;
  bool bVar8;
  int iVar9;
  uint32_t uVar10;
  Table *pTVar11;
  Table *pTVar12;
  _Rb_tree_node_base *p_Var13;
  mapped_type *pmVar14;
  ulong uVar15;
  iterator iVar16;
  mapped_type_conflict *pmVar17;
  long lVar18;
  long lVar19;
  size_t sVar20;
  size_type sVar21;
  _Base_ptr *pp_Var22;
  ulong uVar23;
  ushort uVar24;
  Font *font;
  Font *this_00;
  pointer pFVar25;
  undefined4 *puVar26;
  long lVar27;
  char *__format;
  uint uVar28;
  key_type *pkVar29;
  const_iterator __begin3;
  key_type *pkVar30;
  Table *table;
  Font *pFVar31;
  Table *pTVar32;
  undefined4 *puVar33;
  uint tag;
  vector<woff2::Table,_std::allocator<woff2::Table>_> tables;
  pair<unsigned_int,_unsigned_int> tag_offset;
  uint tag_1;
  map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
  index_by_tag_offset;
  pair<unsigned_int,_unsigned_int> tag_offset_1;
  FontCollection font_collection;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressed_metadata_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> transform_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compression_buf;
  Table local_1d8;
  Font *local_1b0;
  uint8_t *local_1a8;
  uint local_19c;
  key_type *local_198;
  undefined4 *local_190;
  Table *local_188;
  iterator iStack_180;
  Table *local_178;
  WOFF2Params *local_168;
  Font *local_160;
  key_type local_154;
  key_type local_14c;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
  local_148;
  ulong *local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  FontCollection local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
  local_60;
  
  local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header;
  local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
  super__Vector_impl_data._M_start = (Font *)0x0;
  local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
  super__Vector_impl_data._M_finish = (Font *)0x0;
  local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8.tables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar8 = ReadFontCollection(data,length,&local_f8);
  if (bVar8) {
    bVar8 = NormalizeFontCollection(&local_f8);
    if ((bVar8) &&
       ((this_00 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                   _M_impl.super__Vector_impl_data._M_start, puVar7 = result,
        pFVar31 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                  _M_impl.super__Vector_impl_data._M_finish, params->allow_transforms != true ||
        (bVar8 = TransformFontCollection(&local_f8),
        this_00 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                  _M_impl.super__Vector_impl_data._M_start, puVar7 = result,
        pFVar31 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                  _M_impl.super__Vector_impl_data._M_finish, bVar8)))) {
      for (; local_1a8 = puVar7, this_00 != pFVar31; this_00 = this_00 + 1) {
        pTVar11 = Font::FindTable(this_00,0x676c7966);
        pTVar12 = Font::FindTable(this_00,0x6c6f6361);
        if (pTVar11 != (Table *)0x0) {
          pTVar11->flag_byte = pTVar11->flag_byte | 0xc0;
        }
        if (pTVar12 != (Table *)0x0) {
          pTVar12->flag_byte = pTVar12->flag_byte | 0xc0;
        }
        puVar7 = local_1a8;
      }
      local_1b0 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      pkVar30 = (key_type *)0x0;
      pFVar25 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl
                .super__Vector_impl_data._M_start;
      local_168 = params;
      local_118 = result_length;
      if (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          lVar27 = 0;
          for (p_Var13 = (pFVar25->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var13 != &(pFVar25->tables)._M_t._M_impl.super__Rb_tree_header;
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
            bVar8 = Font::Table::IsReused((Table *)&p_Var13[1]._M_parent);
            if ((!bVar8) &&
               ((uVar28 = *(uint *)&p_Var13[1]._M_parent, (uVar28 & 0x80808080) != 0 ||
                (pTVar11 = Font::FindTable(pFVar25,uVar28 | 0x80808080), pTVar11 == (Table *)0x0))))
            {
              lVar27 = lVar27 + (ulong)*(uint *)((long)&p_Var13[1]._M_left + 4);
            }
          }
          pkVar30 = (key_type *)((long)pkVar30 + lVar27);
          pFVar25 = pFVar25 + 1;
        } while (pFVar25 != local_1b0);
      }
      local_190 = (undefined4 *)
                  ((long)((double)((ulong)pkVar30 & 0xffffffff) * 1.2 + 10240.0) & 0xffffffff);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_78,(size_type)local_190,(allocator_type *)&local_148);
      local_198 = pkVar30;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_90,(size_type)pkVar30,(allocator_type *)&local_148);
      local_1b0 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      if (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar27 = 0;
        pFVar25 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          Font::OutputOrderedTags
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_148,pFVar25);
          puVar26 = (undefined4 *)
                    CONCAT44(local_148._M_impl.super__Rb_tree_header._M_header._4_4_,
                             local_148._M_impl.super__Rb_tree_header._M_header._M_color);
          if ((undefined4 *)local_148._M_impl._0_8_ != puVar26) {
            puVar33 = (undefined4 *)local_148._M_impl._0_8_;
            do {
              local_1d8.tag = *puVar33;
              pmVar14 = std::
                        map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                        ::at(&pFVar25->tables,&local_1d8.tag);
              bVar8 = Font::Table::IsReused(pmVar14);
              if ((!bVar8) && ((local_1d8._0_8_ & 0x80808080) == 0)) {
                pTVar11 = Font::FindTable(pFVar25,local_1d8.tag | 0x80808080);
                if (pTVar11 != (Table *)0x0) {
                  pmVar14 = pTVar11;
                }
                uVar28 = pmVar14->length;
                memcpy(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar27,pmVar14->data,(ulong)uVar28
                      );
                lVar27 = lVar27 + (ulong)uVar28;
              }
              puVar33 = puVar33 + 1;
            } while (puVar33 != puVar26);
          }
          if ((undefined4 *)local_148._M_impl._0_8_ != (undefined4 *)0x0) {
            operator_delete((void *)local_148._M_impl._0_8_);
          }
          pFVar25 = pFVar25 + 1;
        } while (pFVar25 != local_1b0);
      }
      pWVar6 = local_168;
      local_148._M_impl._0_8_ = local_190;
      iVar9 = BrotliEncoderCompress
                        (local_168->brotli_quality,0x16,2,local_198,
                         local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_148,
                         local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      if (iVar9 != 0) {
        local_190 = (undefined4 *)(local_148._M_impl._0_8_ & 0xffffffff);
        local_19c = 0;
        fprintf(_stderr,"Compressed %zu to %u.\n",local_198,local_190);
        uVar15 = (ulong)((double)(uint)(pWVar6->extended_metadata)._M_string_length * 1.2 + 10240.0)
        ;
        puVar26 = (undefined4 *)(uVar15 & 0xffffffff);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_a8,(size_type)puVar26,(allocator_type *)&local_148);
        sVar21 = (pWVar6->extended_metadata)._M_string_length;
        if (sVar21 == 0) {
LAB_0010b5a2:
          local_188 = (Table *)0x0;
          iStack_180._M_current = (Table *)0x0;
          local_178 = (Table *)0x0;
          local_148._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_148._M_impl.super__Rb_tree_header._M_header;
          local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_160 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          local_148._M_impl.super__Rb_tree_header._M_header._M_right =
               local_148._M_impl.super__Rb_tree_header._M_header._M_left;
          if (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pFVar25 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              Font::OutputOrderedTags(&local_110,pFVar25);
              pkVar30 = (key_type *)
                        CONCAT44(local_110.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (uint)local_110.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
              if (pkVar30 !=
                  local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_1b0 = (Font *)&pFVar25->tables;
                local_198 = local_110.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                pkVar29 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                do {
                  local_14c = *pkVar30;
                  pmVar14 = std::
                            map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                            ::at((map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                                  *)local_1b0,&local_14c);
                  bVar8 = Font::Table::IsReused(pmVar14);
                  iVar9 = 0xd;
                  if (!bVar8) {
                    local_154.first = pmVar14->tag;
                    local_154.second = pmVar14->offset;
                    iVar16 = std::
                             _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                             ::find(&local_148,&local_154);
                    iVar5._M_current = iStack_180._M_current;
                    pTVar32 = local_188;
                    iVar9 = 1;
                    if ((_Rb_tree_header *)iVar16._M_node ==
                        &local_148._M_impl.super__Rb_tree_header) {
                      pmVar17 = std::
                                map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                ::operator[]((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                              *)&local_148,&local_154);
                      *pmVar17 = (short)((uint)((int)iVar5._M_current - (int)pTVar32) >> 3) *
                                 -0x3333;
                      local_1d8.flags._0_1_ = pmVar14->flag_byte;
                      local_1d8.tag = pmVar14->tag;
                      local_1d8.flags._1_3_ = 0;
                      local_1d8.src_length = pmVar14->length;
                      local_1d8.transform_length = local_1d8.src_length;
                      pTVar11 = Font::FindTable(pFVar25,pmVar14->tag ^ 0x80808080);
                      pkVar29 = local_198;
                      if (pTVar11 != (Table *)0x0) {
                        local_1d8._0_8_ =
                             (ulong)CONCAT14(pTVar11->flag_byte,local_1d8.tag) | 0x10000000000;
                        local_1d8.transform_length = pTVar11->length;
                      }
                      if (iStack_180._M_current == local_178) {
                        std::vector<woff2::Table,std::allocator<woff2::Table>>::
                        _M_realloc_insert<woff2::Table_const&>
                                  ((vector<woff2::Table,std::allocator<woff2::Table>> *)&local_188,
                                   iStack_180,&local_1d8);
                      }
                      else {
                        (iStack_180._M_current)->dst_data = local_1d8.dst_data;
                        (iStack_180._M_current)->transform_length = local_1d8.transform_length;
                        (iStack_180._M_current)->dst_offset = local_1d8.dst_offset;
                        (iStack_180._M_current)->dst_length = local_1d8.dst_length;
                        *(undefined4 *)&(iStack_180._M_current)->field_0x1c = local_1d8._28_4_;
                        (iStack_180._M_current)->tag = local_1d8.tag;
                        (iStack_180._M_current)->flags = local_1d8.flags;
                        (iStack_180._M_current)->src_offset = local_1d8.src_offset;
                        (iStack_180._M_current)->src_length = local_1d8.src_length;
                        iStack_180._M_current = iStack_180._M_current + 1;
                      }
                      iVar9 = 0;
                    }
                  }
                  if ((iVar9 != 0xd) && (iVar9 != 0)) goto LAB_0010b786;
                  pkVar30 = pkVar30 + 1;
                } while (pkVar30 != pkVar29);
              }
              iVar9 = 0xc;
LAB_0010b786:
              if ((void *)CONCAT44(local_110.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_110.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0)
              {
                operator_delete((void *)CONCAT44(local_110.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 (uint)local_110.
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start));
              }
              if ((iVar9 != 0xc) && (iVar9 != 0)) goto LAB_0010c0cc;
              pFVar25 = pFVar25 + 1;
            } while (pFVar25 != local_160);
          }
          std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
          ::_Rb_tree(&local_60,&local_148);
          iVar5._M_current = iStack_180._M_current;
          lVar27 = 0x30;
          for (pTVar32 = local_188; pTVar32 != iVar5._M_current; pTVar32 = pTVar32 + 1) {
            lVar18 = -0xfc;
            do {
              if (*(uint32_t *)(lVar18 + 0x11213c) == pTVar32->tag) {
                lVar18 = (ulong)(lVar18 == 0) * 4 + 1;
                goto LAB_0010b81b;
              }
              lVar18 = lVar18 + 4;
            } while (lVar18 != 0);
            lVar18 = 5;
LAB_0010b81b:
            lVar19 = woff2::Base128Size((ulong)pTVar32->src_length);
            lVar19 = lVar19 + lVar18;
            if ((pTVar32->flags & 0x100) != 0) {
              lVar18 = woff2::Base128Size((ulong)pTVar32->transform_length);
              lVar19 = lVar19 + lVar18;
            }
            lVar27 = lVar27 + lVar19;
          }
          if (local_f8.flavor == 0x74746366) {
            lVar18 = woff2::Size255UShort
                               ((short)((uint)((int)local_f8.fonts.
                                                                                                        
                                                  super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (int)local_f8.fonts.
                                                                                                      
                                                  super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                0x6db7);
            lVar27 = lVar27 + lVar18 +
                     ((long)local_f8.fonts.
                            super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_f8.fonts.
                            super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) * -0x4924924924924924 + 4;
            local_1b0 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            if (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl
                .super__Vector_impl_data._M_start) {
              pFVar25 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                lVar18 = woff2::Size255UShort
                                   ((ushort)(pFVar25->tables)._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count);
                lVar27 = lVar27 + lVar18;
                for (p_Var13 = (pFVar25->tables)._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_left;
                    (_Rb_tree_header *)p_Var13 !=
                    &(pFVar25->tables)._M_t._M_impl.super__Rb_tree_header;
                    p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
                  if ((*(uint *)&p_Var13[1]._M_parent & 0x80808080) == 0) {
                    local_1d8.flags = *(undefined4 *)&p_Var13[1]._M_left;
                    local_1d8.tag = *(uint *)&p_Var13[1]._M_parent;
                    pmVar17 = std::
                              map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                              ::operator[]((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                            *)&local_60,(key_type *)&local_1d8);
                    lVar18 = woff2::Size255UShort(*pmVar17);
                    lVar27 = lVar27 + lVar18;
                  }
                }
                pFVar25 = pFVar25 + 1;
              } while (pFVar25 != local_1b0);
            }
          }
          pFVar31 = (Font *)((ulong)local_190 & 0xffffffff);
          pkVar30 = (key_type *)(ulong)local_19c;
          uVar23 = (long)&pFVar31->flavor + lVar27;
          uVar15 = (long)&pFVar31->flavor + lVar27 + 3 & 0xfffffffffffffffc;
          if (0xfffffffffffffffc < uVar23) {
            uVar15 = uVar23;
          }
          uVar15 = uVar15 + (long)pkVar30;
          std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
          ::~_Rb_tree(&local_60);
          pWVar6 = local_168;
          puVar7 = local_1a8;
          uVar23 = *local_118;
          if (uVar23 < uVar15) {
            __format = "Result allocation was too small (%zd vs %zd bytes).\n";
          }
          else {
            *local_118 = uVar15;
            builtin_memcpy(local_1a8,"wOF2",4);
            if (local_f8.flavor == 0x74746366) {
              local_1a8[4] = 't';
              local_1a8[5] = 't';
              local_1a8[6] = 'c';
              uVar10 = 0x66;
            }
            else {
              uVar10 = (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                        ._M_impl.super__Vector_impl_data._M_start)->flavor;
              local_1a8[4] = (uint8_t)(uVar10 >> 0x18);
              local_1a8[5] = (uint8_t)(uVar10 >> 0x10);
              local_1a8[6] = (uint8_t)(uVar10 >> 8);
            }
            local_1a8[7] = (uint8_t)uVar10;
            local_1a8[8] = (uint8_t)(uVar15 >> 0x18);
            local_1a8[9] = (uint8_t)(uVar15 >> 0x10);
            local_1a8[10] = (uint8_t)(uVar15 >> 8);
            local_1a8[0xb] = (uint8_t)uVar15;
            sVar2 = (short)((uint)((int)iStack_180._M_current - (int)local_188) >> 3);
            *(ushort *)(local_1a8 + 0xc) = sVar2 * -0x3300 | (ushort)(sVar2 * -0x3333) >> 8;
            local_1a8[0xe] = '\0';
            local_1a8[0xf] = '\0';
            local_1d8.tag = 0x10;
            local_1d8.flags = 0;
            local_198 = pkVar30;
            local_160 = pFVar31;
            sVar20 = anon_unknown_0::ComputeUncompressedLength(&local_f8);
            iVar5._M_current = iStack_180._M_current;
            puVar4 = local_1a8;
            puVar7[local_1d8._0_8_] = (uint8_t)(sVar20 >> 0x18);
            puVar7[local_1d8._0_8_ + 1] = (uint8_t)(sVar20 >> 0x10);
            puVar7[local_1d8._0_8_ + 2] = (uint8_t)(sVar20 >> 8);
            puVar7[local_1d8._0_8_ + 3] = (uint8_t)sVar20;
            puVar7[local_1d8._0_8_ + 4] = (uint8_t)((ulong)local_190 >> 0x18);
            puVar7[local_1d8._0_8_ + 5] = (uint8_t)((ulong)local_190 >> 0x10);
            puVar7[local_1d8._0_8_ + 6] = (uint8_t)((ulong)local_190 >> 8);
            puVar7[local_1d8._0_8_ + 7] = (uint8_t)local_190;
            (puVar7 + local_1d8._0_8_ + 8)[0] = '\0';
            (puVar7 + local_1d8._0_8_ + 8)[1] = '\x01';
            (puVar7 + local_1d8._0_8_ + 10)[0] = '\0';
            (puVar7 + local_1d8._0_8_ + 10)[1] = '\0';
            if (local_19c == 0) {
              sVar21 = 0;
              puVar7[local_1d8._0_8_ + 0xc] = '\0';
              puVar7[local_1d8._0_8_ + 0xd] = '\0';
              puVar7[local_1d8._0_8_ + 0xe] = '\0';
              puVar7[local_1d8._0_8_ + 0xf] = '\0';
              puVar7[local_1d8._0_8_ + 0x10] = '\0';
              puVar7[local_1d8._0_8_ + 0x11] = '\0';
              puVar7[local_1d8._0_8_ + 0x12] = '\0';
              puVar7[local_1d8._0_8_ + 0x13] = '\0';
              puVar7[local_1d8._0_8_ + 0x14] = '\0';
              puVar7[local_1d8._0_8_ + 0x15] = '\0';
              puVar7[local_1d8._0_8_ + 0x16] = '\0';
            }
            else {
              iVar9 = (int)uVar15 - local_19c;
              puVar7[local_1d8._0_8_ + 0xc] = (uint8_t)((uint)iVar9 >> 0x18);
              puVar7[local_1d8._0_8_ + 0xd] = (uint8_t)((uint)iVar9 >> 0x10);
              puVar7[local_1d8._0_8_ + 0xe] = (uint8_t)((uint)iVar9 >> 8);
              puVar7[local_1d8._0_8_ + 0xf] = (uint8_t)iVar9;
              puVar7[local_1d8._0_8_ + 0x10] = (uint8_t)(local_19c >> 0x18);
              puVar7[local_1d8._0_8_ + 0x11] = (uint8_t)(local_19c >> 0x10);
              puVar7[local_1d8._0_8_ + 0x12] = (uint8_t)(local_19c >> 8);
              puVar7[local_1d8._0_8_ + 0x13] = (uint8_t)local_19c;
              sVar21 = (pWVar6->extended_metadata)._M_string_length;
              puVar7[local_1d8._0_8_ + 0x14] = (uint8_t)(sVar21 >> 0x18);
              puVar7[local_1d8._0_8_ + 0x15] = (uint8_t)(sVar21 >> 0x10);
              puVar7[local_1d8._0_8_ + 0x16] = (uint8_t)(sVar21 >> 8);
            }
            puVar7[local_1d8._0_8_ + 0x17] = (uint8_t)sVar21;
            puVar7[local_1d8._0_8_ + 0x18] = '\0';
            puVar7[local_1d8._0_8_ + 0x19] = '\0';
            puVar7[local_1d8._0_8_ + 0x1a] = '\0';
            puVar7[local_1d8._0_8_ + 0x1b] = '\0';
            puVar7[local_1d8._0_8_ + 0x1c] = '\0';
            puVar7[local_1d8._0_8_ + 0x1d] = '\0';
            puVar7[local_1d8._0_8_ + 0x1e] = '\0';
            uVar15 = local_1d8._0_8_ + 0x20;
            puVar7[local_1d8._0_8_ + 0x1f] = '\0';
            local_1d8._0_8_ = uVar15;
            if (local_188 != iStack_180._M_current) {
              pTVar32 = local_188;
              do {
                lVar27 = 0;
                do {
                  if (*(uint32_t *)((long)&kKnownTags + lVar27 * 4) == pTVar32->tag)
                  goto LAB_0010bd7c;
                  lVar27 = lVar27 + 1;
                } while (lVar27 != 0x3f);
                lVar27 = 0x3f;
LAB_0010bd7c:
                puVar4[local_1d8._0_8_] = (byte)pTVar32->flags & 0xc0 | (byte)lVar27;
                uVar15 = local_1d8._0_8_ + 1;
                if ((~(uint)lVar27 & 0x3f) == 0) {
                  uVar10 = pTVar32->tag;
                  puVar4[local_1d8._0_8_ + 1] = (uchar)(uVar10 >> 0x18);
                  puVar4[local_1d8._0_8_ + 2] = (uchar)(uVar10 >> 0x10);
                  puVar4[local_1d8._0_8_ + 3] = (uchar)(uVar10 >> 8);
                  puVar4[local_1d8._0_8_ + 4] = (uchar)uVar10;
                  uVar15 = local_1d8._0_8_ + 5;
                }
                local_1d8._0_8_ = uVar15;
                woff2::StoreBase128((ulong)pTVar32->src_length,(ulong *)&local_1d8,puVar4);
                if ((pTVar32->flags & 0x100) != 0) {
                  woff2::StoreBase128((ulong)pTVar32->transform_length,(ulong *)&local_1d8,local_1a8
                                     );
                }
                pTVar32 = pTVar32 + 1;
              } while (pTVar32 != iVar5._M_current);
            }
            if (local_f8.flavor == 0x74746366) {
              local_1a8[local_1d8._0_8_] = (uchar)(local_f8.header_version >> 0x18);
              local_1a8[local_1d8._0_8_ + 1] = (uchar)(local_f8.header_version >> 0x10);
              local_1a8[local_1d8._0_8_ + 2] = (uchar)(local_f8.header_version >> 8);
              local_1a8[local_1d8._0_8_ + 3] = (uchar)local_f8.header_version;
              local_1d8._0_8_ = local_1d8._0_8_ + 4;
              woff2::Store255UShort
                        ((int)((ulong)((long)local_f8.fonts.
                                             super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_f8.fonts.
                                            super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x49249249,(ulong *)&local_1d8,local_1a8);
              local_1b0 = local_f8.fonts.
                          super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              pFVar31 = local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_f8.fonts.super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                do {
                  p_Var13 = (pFVar31->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  p_Var1 = &(pFVar31->tables)._M_t._M_impl.super__Rb_tree_header;
                  uVar28 = 0;
                  if ((_Rb_tree_header *)p_Var13 != p_Var1) {
                    uVar24 = 0;
                    do {
                      uVar24 = uVar24 + (((ulong)p_Var13[1]._M_parent & 0x80808080) == 0);
                      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
                    } while ((_Rb_tree_header *)p_Var13 != p_Var1);
                    uVar28 = (uint)uVar24;
                  }
                  puVar7 = local_1a8;
                  woff2::Store255UShort(uVar28,(ulong *)&local_1d8,local_1a8);
                  uVar10 = pFVar31->flavor;
                  puVar7[local_1d8._0_8_] = (uchar)(uVar10 >> 0x18);
                  puVar7[local_1d8._0_8_ + 1] = (uchar)(uVar10 >> 0x10);
                  puVar7[local_1d8._0_8_ + 2] = (uchar)(uVar10 >> 8);
                  puVar7[local_1d8._0_8_ + 3] = (uchar)uVar10;
                  local_1d8._0_8_ = local_1d8._0_8_ + 4;
                  for (p_Var13 = (pFVar31->tables)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left; (_Rb_tree_header *)p_Var13 != p_Var1;
                      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
                    iVar9 = 0x15;
                    if (((ulong)p_Var13[1]._M_parent & 0x80808080) == 0) {
                      this = &p_Var13[1]._M_parent;
                      bVar8 = Font::Table::IsReused((Table *)this);
                      pp_Var22 = &p_Var13[1]._M_left;
                      if (bVar8) {
                        pp_Var22 = &(p_Var13[2]._M_right)->_M_parent;
                      }
                      uVar28 = *(uint *)pp_Var22;
                      Font::Table::IsReused((Table *)this);
                      local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_ = *(uint *)this;
                      local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_ = uVar28;
                      iVar16 = std::
                               _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                               ::find(&local_148,(key_type *)&local_110);
                      if ((_Rb_tree_header *)iVar16._M_node ==
                          &local_148._M_impl.super__Rb_tree_header) {
                        fprintf(_stderr,"Missing table index for offset 0x%08x\n",(ulong)uVar28);
                        iVar9 = 1;
                      }
                      else {
                        pmVar17 = std::
                                  map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                  ::operator[]((map<std::pair<unsigned_int,_unsigned_int>,_unsigned_short,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
                                                *)&local_148,(key_type *)&local_110);
                        iVar9 = 0;
                        woff2::Store255UShort((uint)*pmVar17,(ulong *)&local_1d8,local_1a8);
                      }
                    }
                    if ((iVar9 != 0x15) && (iVar9 != 0)) goto LAB_0010c020;
                  }
                  iVar9 = 0x14;
LAB_0010c020:
                  if ((iVar9 != 0x14) && (iVar9 != 0)) goto LAB_0010c0cc;
                  pFVar31 = pFVar31 + 1;
                } while (pFVar31 != local_1b0);
              }
            }
            pFVar31 = local_160;
            puVar7 = local_1a8;
            uVar3 = local_1d8._0_8_;
            memcpy(local_1a8 + local_1d8._0_8_,
                   local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(size_t)local_160);
            pkVar30 = local_198;
            uVar23 = (long)&pFVar31->flavor + uVar3;
            uVar15 = (long)&pFVar31->flavor + uVar3 + 3 & 0xfffffffffffffffc;
            if (0xfffffffffffffffc < uVar23) {
              uVar15 = uVar23;
            }
            local_1d8._0_8_ = uVar15;
            memcpy(puVar7 + uVar15,
                   local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(size_t)local_198);
            uVar15 = uVar15 + (long)pkVar30;
            uVar23 = *local_118;
            bVar8 = true;
            local_1d8._0_8_ = uVar15;
            if (uVar23 == uVar15) goto LAB_0010c0ea;
            __format = "Mismatch between computed and actual length (%zd vs %zd)\n";
          }
          bVar8 = false;
          fprintf(_stderr,__format,uVar23,uVar15);
          goto LAB_0010c0ea;
        }
        local_148._M_impl._0_8_ = puVar26;
        iVar9 = BrotliEncoderCompress
                          (pWVar6->brotli_quality,0x16,1,sVar21,
                           (pWVar6->extended_metadata)._M_dataplus._M_p,&local_148,
                           local_a8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
        local_19c = (uint)uVar15;
        if (iVar9 != 0) {
          local_19c = local_148._M_impl._0_4_;
          goto LAB_0010b5a2;
        }
        ConvertTTFToWOFF2();
        bVar8 = false;
        goto LAB_0010c106;
      }
      ConvertTTFToWOFF2((woff2 *)_stderr);
      bVar8 = false;
      goto LAB_0010c118;
    }
  }
  else {
    ConvertTTFToWOFF2();
  }
  bVar8 = false;
  goto LAB_0010b241;
LAB_0010c0cc:
  bVar8 = false;
LAB_0010c0ea:
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_short>_>_>
  ::~_Rb_tree(&local_148);
  if (local_188 != (Table *)0x0) {
    operator_delete(local_188);
  }
LAB_0010c106:
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0010c118:
  if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0010b241:
  std::vector<woff2::Font,_std::allocator<woff2::Font>_>::~vector(&local_f8.fonts);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table_*>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
  ::~_Rb_tree(&local_f8.tables._M_t);
  return bVar8;
}

Assistant:

bool ConvertTTFToWOFF2(const uint8_t *data, size_t length,
                       uint8_t *result, size_t *result_length,
                       const WOFF2Params& params) {
  FontCollection font_collection;
  if (!ReadFontCollection(data, length, &font_collection)) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Parsing of the input font failed.\n");
#endif
    return FONT_COMPRESSION_FAILURE();
  }

  if (!NormalizeFontCollection(&font_collection)) {
    return FONT_COMPRESSION_FAILURE();
  }

  if (params.allow_transforms && !TransformFontCollection(&font_collection)) {
    return FONT_COMPRESSION_FAILURE();
  } else {
    // glyf/loca use 11 to flag "not transformed"
    for (auto& font : font_collection.fonts) {
      Font::Table* glyf_table = font.FindTable(kGlyfTableTag);
      Font::Table* loca_table = font.FindTable(kLocaTableTag);
      if (glyf_table) {
        glyf_table->flag_byte |= 0xc0;
      }
      if (loca_table) {
        loca_table->flag_byte |= 0xc0;
      }
    }
  }

  // Although the compressed size of each table in the final woff2 file won't
  // be larger than its transform_length, we have to allocate a large enough
  // buffer for the compressor, since the compressor can potentially increase
  // the size. If the compressor overflows this, it should return false and
  // then this function will also return false.

  size_t total_transform_length = 0;
  for (const auto& font : font_collection.fonts) {
    total_transform_length += ComputeTotalTransformLength(font);
  }
  size_t compression_buffer_size = CompressedBufferSize(total_transform_length);
  std::vector<uint8_t> compression_buf(compression_buffer_size);
  uint32_t total_compressed_length = compression_buffer_size;

  // Collect all transformed data into one place in output order.
  std::vector<uint8_t> transform_buf(total_transform_length);
  size_t transform_offset = 0;
  for (const auto& font : font_collection.fonts) {
    for (const auto tag : font.OutputOrderedTags()) {
      const Font::Table& original = font.tables.at(tag);
      if (original.IsReused()) continue;
      if (tag & 0x80808080) continue;
      const Font::Table* table_to_store = font.FindTable(tag ^ 0x80808080);
      if (table_to_store == NULL) table_to_store = &original;

      StoreBytes(table_to_store->data, table_to_store->length,
                 &transform_offset, &transform_buf[0]);
    }
  }

  // Compress all transformed data in one stream.
  if (!Woff2Compress(transform_buf.data(), total_transform_length,
                     &compression_buf[0],
                     &total_compressed_length,
                     params.brotli_quality)) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Compression of combined table failed.\n");
#endif
    return FONT_COMPRESSION_FAILURE();
  }

#ifdef FONT_COMPRESSION_BIN
  fprintf(stderr, "Compressed %zu to %u.\n", total_transform_length,
          total_compressed_length);
#endif

  // Compress the extended metadata
  // TODO(user): how does this apply to collections
  uint32_t compressed_metadata_buf_length =
    CompressedBufferSize(params.extended_metadata.length());
  std::vector<uint8_t> compressed_metadata_buf(compressed_metadata_buf_length);

  if (params.extended_metadata.length() > 0) {
    if (!TextCompress((const uint8_t*)params.extended_metadata.data(),
                      params.extended_metadata.length(),
                      compressed_metadata_buf.data(),
                      &compressed_metadata_buf_length,
                      params.brotli_quality)) {
#ifdef FONT_COMPRESSION_BIN
      fprintf(stderr, "Compression of extended metadata failed.\n");
#endif
      return FONT_COMPRESSION_FAILURE();
    }
  } else {
    compressed_metadata_buf_length = 0;
  }

  std::vector<Table> tables;
  std::map<std::pair<uint32_t, uint32_t>, uint16_t> index_by_tag_offset;

  for (const auto& font : font_collection.fonts) {

    for (const auto tag : font.OutputOrderedTags()) {
      const Font::Table& src_table = font.tables.at(tag);
      if (src_table.IsReused()) {
        continue;
      }

      std::pair<uint32_t, uint32_t> tag_offset(src_table.tag, src_table.offset);
      if (index_by_tag_offset.find(tag_offset) == index_by_tag_offset.end()) {
        index_by_tag_offset[tag_offset] = tables.size();
      } else {
        return false;
      }

      Table table;
      table.tag = src_table.tag;
      table.flags = src_table.flag_byte;
      table.src_length = src_table.length;
      table.transform_length = src_table.length;
      const uint8_t* transformed_data = src_table.data;
      const Font::Table* transformed_table =
          font.FindTable(src_table.tag ^ 0x80808080);
      if (transformed_table != NULL) {
        table.flags = transformed_table->flag_byte;
        table.flags |= kWoff2FlagsTransform;
        table.transform_length = transformed_table->length;
        transformed_data = transformed_table->data;

      }
      tables.push_back(table);
    }
  }

  size_t woff2_length = ComputeWoff2Length(font_collection, tables,
      index_by_tag_offset, total_compressed_length,
      compressed_metadata_buf_length);
  if (woff2_length > *result_length) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Result allocation was too small (%zd vs %zd bytes).\n",
           *result_length, woff2_length);
#endif
    return FONT_COMPRESSION_FAILURE();
  }
  *result_length = woff2_length;

  size_t offset = 0;

  // start of woff2 header (http://www.w3.org/TR/WOFF2/#woff20Header)
  StoreU32(kWoff2Signature, &offset, result);
  if (font_collection.flavor != kTtcFontFlavor) {
    StoreU32(font_collection.fonts[0].flavor, &offset, result);
  } else {
    StoreU32(kTtcFontFlavor, &offset, result);
  }
  StoreU32(woff2_length, &offset, result);
  Store16(tables.size(), &offset, result);
  Store16(0, &offset, result);  // reserved
  // totalSfntSize
  StoreU32(ComputeUncompressedLength(font_collection), &offset, result);
  StoreU32(total_compressed_length, &offset, result);  // totalCompressedSize

  // Let's just all be v1.0
  Store16(1, &offset, result);  // majorVersion
  Store16(0, &offset, result);  // minorVersion
  if (compressed_metadata_buf_length > 0) {
    StoreU32(woff2_length - compressed_metadata_buf_length,
             &offset, result);  // metaOffset
    StoreU32(compressed_metadata_buf_length, &offset, result);  // metaLength
    StoreU32(params.extended_metadata.length(),
             &offset, result);  // metaOrigLength
  } else {
    StoreU32(0, &offset, result);  // metaOffset
    StoreU32(0, &offset, result);  // metaLength
    StoreU32(0, &offset, result);  // metaOrigLength
  }
  StoreU32(0, &offset, result);  // privOffset
  StoreU32(0, &offset, result);  // privLength
  // end of woff2 header

  // table directory (http://www.w3.org/TR/WOFF2/#table_dir_format)
  for (const auto& table : tables) {
    StoreTableEntry(table, &offset, result);
  }

  // for collections only, collection table directory
  if (font_collection.flavor == kTtcFontFlavor) {
    StoreU32(font_collection.header_version, &offset, result);
    Store255UShort(font_collection.fonts.size(), &offset, result);
    for (const Font& font : font_collection.fonts) {

      uint16_t num_tables = 0;
      for (const auto& entry : font.tables) {
        const Font::Table& table = entry.second;
        if (table.tag & 0x80808080) continue;  // don't write xform tables
        num_tables++;
      }
      Store255UShort(num_tables, &offset, result);

      StoreU32(font.flavor, &offset, result);
      for (const auto& entry : font.tables) {
        const Font::Table& table = entry.second;
        if (table.tag & 0x80808080) continue;  // don't write xform tables

        // for reused tables, only the original has an updated offset
        uint32_t table_offset =
          table.IsReused() ? table.reuse_of->offset : table.offset;
        uint32_t table_length =
          table.IsReused() ? table.reuse_of->length : table.length;
        std::pair<uint32_t, uint32_t> tag_offset(table.tag, table_offset);
        if (index_by_tag_offset.find(tag_offset) == index_by_tag_offset.end()) {
#ifdef FONT_COMPRESSION_BIN
fprintf(stderr, "Missing table index for offset 0x%08x\n",
                  table_offset);
#endif
          return FONT_COMPRESSION_FAILURE();
        }
        uint16_t index = index_by_tag_offset[tag_offset];
        Store255UShort(index, &offset, result);

      }

    }
  }

  // compressed data format (http://www.w3.org/TR/WOFF2/#table_format)

  StoreBytes(&compression_buf[0], total_compressed_length, &offset, result);
  offset = Round4(offset);

  StoreBytes(compressed_metadata_buf.data(), compressed_metadata_buf_length,
             &offset, result);

  if (*result_length != offset) {
#ifdef FONT_COMPRESSION_BIN
    fprintf(stderr, "Mismatch between computed and actual length "
            "(%zd vs %zd)\n", *result_length, offset);
#endif
    return FONT_COMPRESSION_FAILURE();
  }
  return true;
}